

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void search_intra_modes_in_interframe
               (InterModeSearchState *search_state,AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,
               BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,InterModeSFArgs *sf_args,
               uint intra_ref_frame_cost,int64_t yrd_threshold)

{
  THR_MODES TVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  RD_STATS *rd_cost_y;
  qm_val_t *pqVar5;
  RD_STATS *best_rd_stats_dst;
  qm_val_t *in_RDX;
  qm_val_t *in_RSI;
  long *in_RDI;
  BLOCK_SIZE in_R8B;
  long in_stack_00000008;
  long in_stack_00000018;
  int txfm_search_done;
  int i_1;
  int64_t this_rd;
  int skip_ctx;
  int uv_mode_cost;
  PREDICTION_MODE mode;
  ModeCosts *mode_costs;
  int intra_uv_mode_valid;
  int num_planes;
  RD_STATS intra_rd_stats_uv;
  RD_STATS intra_rd_stats;
  int is_luma_result_valid;
  int64_t intra_rd_y;
  int mode_cost_y;
  RD_STATS intra_rd_stats_y;
  PREDICTION_MODE this_mode;
  THR_MODES mode_enum;
  int mode_idx;
  int bw;
  int bh;
  int i;
  int64_t top_intra_model_rd [4];
  int64_t best_model_rd;
  int num_4x4;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  THR_MODES best_mode_enum;
  MB_MODE_INFO best_mbmi;
  int best_mode_cost_y;
  int64_t best_rd_y;
  RD_STATS best_intra_rd_stats_y;
  int is_best_y_mode_intra;
  IntraModeSearchState *intra_search_state;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  IntraModeCfg *intra_mode_cfg;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  AV1_COMMON *in_stack_fffffffffffff538;
  MV_REFERENCE_FRAME *in_stack_fffffffffffff540;
  int_mv *in_stack_fffffffffffff548;
  MB_MODE_INFO *in_stack_fffffffffffff550;
  MACROBLOCK *in_stack_fffffffffffff558;
  AV1_COMP *in_stack_fffffffffffff560;
  RD_STATS *in_stack_fffffffffffff568;
  RD_STATS *in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  undefined4 uVar6;
  int iVar7;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  undefined4 in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffff5a0;
  BLOCK_SIZE bsize_00;
  int in_stack_fffffffffffff5a8;
  int in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b4;
  MACROBLOCK *in_stack_fffffffffffff5b8;
  AV1_COMP *in_stack_fffffffffffff5c0;
  THR_MODES in_stack_fffffffffffff5d0;
  undefined7 in_stack_fffffffffffff5d1;
  int in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  PICK_MODE_CONTEXT *in_stack_fffffffffffff5e8;
  RD_STATS *this_rd_00;
  uint in_stack_fffffffffffff5f0;
  BLOCK_SIZE in_stack_fffffffffffff5f7;
  uint in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  undefined4 in_stack_fffffffffffff600;
  int in_stack_fffffffffffff604;
  int_mv local_9ec;
  undefined1 local_9e8 [8];
  RD_STATS *in_stack_fffffffffffff620;
  int64_t in_stack_fffffffffffff628;
  int *in_stack_fffffffffffff630;
  int64_t *in_stack_fffffffffffff638;
  undefined6 in_stack_fffffffffffff640;
  int iVar9;
  uint in_stack_fffffffffffff64c;
  int local_9ac;
  undefined1 local_988 [2252];
  int_mv local_bc;
  qm_val_t *local_b8;
  int local_b0 [2];
  qm_val_t *local_a8;
  int local_84;
  long *local_80;
  MB_MODE_INFO *local_78;
  MACROBLOCKD *local_70;
  qm_val_t *local_68;
  qm_val_t *local_60;
  AV1_COMMON *local_58;
  BLOCK_SIZE local_41;
  qm_val_t *local_38;
  qm_val_t *local_30;
  long *local_28;
  
  local_58 = (AV1_COMMON *)(in_RSI + 0x3bf80);
  local_60 = in_RSI + 0x608c0;
  local_68 = in_RSI + 0x426e7;
  local_70 = (MACROBLOCKD *)(in_RDX + 0x1a0);
  local_78 = (MB_MODE_INFO *)**(undefined8 **)(in_RDX + 0x2058);
  local_80 = in_RDI + 0x63f;
  local_84 = 0;
  local_b8 = (qm_val_t *)0x7fffffffffffffff;
  local_bc.as_int = 0xffffffff;
  local_41 = in_R8B;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  memcpy(local_988 + 0x818,(void *)**(undefined8 **)(in_RDX + 0x2058),0xb0);
  local_988[0x817] = 0xff;
  local_988._12_4_ = bsize_to_num_blk(local_41);
  local_988._0_8_ = (int16_t *)0x7fffffffffffffff;
  for (local_9ac = 0; local_9ac < 4; local_9ac = local_9ac + 1) {
    *(undefined8 *)(&stack0xfffffffffffff658 + (long)local_9ac * 8) = 0x7fffffffffffffff;
  }
  if ((*(int *)(local_30 + 0x42350) == 0) ||
     ((in_stack_fffffffffffff64c =
            (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [local_41],
      "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_41] < 5 &&
      (in_stack_fffffffffffff64c < 5)))) {
    iVar9 = 0;
    while ((bsize_00 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffff5a0 >> 0x38), iVar9 < 0x3d &&
           ((*(int *)(local_60 + 0x2c4) == 0 || (*(int *)((long)local_28 + 0x31fc) == 0))))) {
      set_y_mode_and_delta_angle(iVar9,local_78,*(int *)(local_60 + 0x2f8));
      if (((((**(uint **)(in_stack_00000008 + 8) & 1 << (local_78->mode & 0x1f)) == 0) &&
           (((TVar1 = get_prediction_mode_idx(local_78->mode,'\0',-1), (local_68[2] & 1) != 0 &&
             (*(int *)(local_30 + 0x60b90) == 0)) ||
            ((local_78->mode != '\t' && ((local_78->mode != '\v' && (local_78->mode != '\n'))))))))
          && (((local_68[3] & 1) != 0 || (local_78->mode != '\f')))) &&
         ((iVar3 = av1_is_directional_mode(local_78->mode), iVar3 == 0 ||
          (((iVar3 = av1_use_angle_delta(local_41), iVar3 != 0 && ((local_68[7] & 1) != 0)) ||
           (local_78->angle_delta[0] == '\0')))))) {
        bVar2 = local_78->mode;
        init_mbmi(in_stack_fffffffffffff550,
                  (PREDICTION_MODE)((ulong)in_stack_fffffffffffff548 >> 0x38),
                  in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        local_38[0x24e08] = '\0';
        if ((bVar2 == 0) ||
           (((((*(uint *)(local_60 + 1000) & 8) == 0 || (bVar2 < 3)) ||
             ((0xc < bVar2 || (((char)local_28[0x1b] == -1 || ((char)local_28[5] < '\x01')))))) &&
            (((*(uint *)(local_60 + 1000) & 0x10) == 0 ||
             (iVar3 = conditional_skipintra(bVar2,(PREDICTION_MODE)local_28[0x63f]), iVar3 == 0)))))
           ) {
          pqVar5 = (qm_val_t *)0x7fffffffffffffff;
          in_stack_fffffffffffff540 = (MV_REFERENCE_FRAME *)*local_28;
          in_stack_fffffffffffff560 = (AV1_COMP *)&stack0xfffffffffffff658;
          in_stack_fffffffffffff538 = (AV1_COMMON *)local_9e8;
          in_stack_fffffffffffff548 = &local_9ec;
          in_stack_fffffffffffff550 = (MB_MODE_INFO *)&stack0xfffffffffffff608;
          in_stack_fffffffffffff558 = (MACROBLOCK *)local_988;
          in_stack_fffffffffffff604 =
               av1_handle_intra_y_mode
                         ((IntraModeSearchState *)0x7fffffffffffffff,
                          (AV1_COMP *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
                          (MACROBLOCK *)
                          CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                          in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0,
                          in_stack_fffffffffffff5e8,in_stack_fffffffffffff620,
                          in_stack_fffffffffffff628,in_stack_fffffffffffff630,
                          in_stack_fffffffffffff638,
                          (int64_t *)CONCAT17(TVar1,CONCAT16(bVar2,in_stack_fffffffffffff640)),
                          (int64_t *)CONCAT44(in_stack_fffffffffffff64c,iVar9));
          if ((long)pqVar5 < 0x7fffffffffffffff) {
            adjust_cost(in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                        (int64_t *)in_stack_fffffffffffff550);
          }
          if (((in_stack_fffffffffffff604 != 0) && ((long)pqVar5 < in_stack_00000018)) &&
             (local_84 = 1, (long)pqVar5 < (long)local_b8)) {
            memcpy(local_b0,local_9e8,0x28);
            local_bc = local_9ec;
            local_b8 = pqVar5;
            memcpy(local_988 + 0x818,local_78,0xb0);
            local_988[0x817] = TVar1;
            memcpy(local_988 + 0x410,local_38 + 0x24e09,(long)(int)local_988._12_4_);
            memcpy(local_988 + 0x10,local_70->tx_type_map,(long)(int)local_988._12_4_);
          }
        }
      }
      iVar9 = iVar9 + 1;
    }
    if (local_84 != 0) {
      memcpy(local_78,local_988 + 0x818,0xb0);
      memcpy(local_38 + 0x24e09,local_988 + 0x410,(long)(int)local_988._12_4_);
      memcpy(local_70->tx_type_map,local_988 + 0x10,(long)(int)local_988._12_4_);
      av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffff5d8);
      av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffff5b0);
      iVar9 = av1_num_planes(local_58);
      if ((iVar9 < 2) ||
         (in_stack_fffffffffffff5a8 =
               av1_search_intra_uv_modes_in_interframe
                         ((IntraModeSearchState *)in_stack_fffffffffffff5b8,
                          (AV1_COMP *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                          (MACROBLOCK *)CONCAT44(iVar9,in_stack_fffffffffffff5a8),bsize_00,
                          (RD_STATS *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                          (RD_STATS *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                          (RD_STATS *)CONCAT71(in_stack_fffffffffffff5d1,in_stack_fffffffffffff5d0),
                          CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8)),
         in_stack_fffffffffffff5a8 != 0)) {
        iVar3 = local_b0[0] + local_bc.as_int;
        if ((local_70->lossless[(byte)*(undefined2 *)&local_78->field_0xa7 & 7] == 0) &&
           (iVar4 = block_signals_txsize(local_41), iVar4 != 0)) {
          iVar4 = tx_size_cost(in_stack_fffffffffffff558,
                               (BLOCK_SIZE)((ulong)in_stack_fffffffffffff550 >> 0x38),
                               (TX_SIZE)((ulong)in_stack_fffffffffffff550 >> 0x30));
          local_b0[0] = local_b0[0] - iVar4;
        }
        rd_cost_y = (RD_STATS *)(local_38 + 0x4230);
        uVar8 = CONCAT13(local_78->mode,(int3)in_stack_fffffffffffff59c);
        if ((1 < iVar9) && ((local_70->is_chroma_ref & 1U) != 0)) {
          in_stack_fffffffffffff570 = (RD_STATS *)(local_38 + 0x6874);
          in_stack_fffffffffffff57c = in_stack_fffffffffffff5b0;
          bVar2 = is_cfl_allowed((MACROBLOCKD *)in_stack_fffffffffffff558);
          in_stack_fffffffffffff598 =
               *(undefined4 *)
                ((long)in_stack_fffffffffffff570 +
                (ulong)local_78->uv_mode * 4 +
                (ulong)(byte)((uint)uVar8 >> 0x18) * 0x38 + (ulong)bVar2 * 0x2d8);
          in_stack_fffffffffffff5b0 = in_stack_fffffffffffff57c;
          iVar4 = intra_mode_info_cost_uv
                            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                             (MB_MODE_INFO *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff57c),
                             (BLOCK_SIZE)((uint)iVar9 >> 0x18),in_stack_fffffffffffff5a8);
          iVar3 = in_stack_fffffffffffff57c + iVar4 + iVar3;
        }
        in_stack_fffffffffffff5f8 = in_stack_fffffffffffff5f8 & 0xffffff00;
        pqVar5 = local_a8 + (long)in_stack_fffffffffffff5b8;
        iVar4 = av1_get_skip_txfm_context(local_70);
        iVar3 = (int)(&rd_cost_y[0x1db].sse)[iVar4] + iVar3;
        best_rd_stats_dst =
             (RD_STATS *)
             (((long)iVar3 * (long)*(int *)(local_38 + 0x4218) + 0x100 >> 9) + (long)pqVar5 * 0x80);
        if ((long)best_rd_stats_dst < local_28[0xd1]) {
          local_28[0xd1] = (long)best_rd_stats_dst;
          *(char *)local_80 = (char)((uint)uVar8 >> 0x18);
        }
        for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
          in_stack_fffffffffffff568 = best_rd_stats_dst;
          if (local_28[(long)iVar7 + 0xd3] < (long)best_rd_stats_dst) {
            in_stack_fffffffffffff568 = (RD_STATS *)local_28[(long)iVar7 + 0xd3];
          }
          local_28[(long)iVar7 + 0xd3] = (long)in_stack_fffffffffffff568;
        }
        this_rd_00 = best_rd_stats_dst;
        adjust_rdcost(in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                      (RD_STATS *)in_stack_fffffffffffff550);
        uVar6 = 1;
        store_winner_mode_stats
                  ((AV1_COMMON *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                   (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   (RD_STATS *)CONCAT44(iVar9,in_stack_fffffffffffff5a8),rd_cost_y,
                   (RD_STATS *)CONCAT44(uVar8,in_stack_fffffffffffff598),in_stack_fffffffffffff5d0,
                   (uint8_t *)CONCAT44(in_stack_fffffffffffff5dc,iVar3),(BLOCK_SIZE)pqVar5,
                   (int64_t)this_rd_00,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5f8);
        if ((long)this_rd_00 < *local_28) {
          update_search_state((InterModeSearchState *)CONCAT44(iVar4,in_stack_fffffffffffff590),
                              best_rd_stats_dst,(PICK_MODE_CONTEXT *)CONCAT44(iVar7,uVar6),
                              (RD_STATS *)
                              CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                              in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                              (THR_MODES)rd_cost_y,
                              (MACROBLOCK *)CONCAT44(iVar9,in_stack_fffffffffffff5a8),
                              in_stack_fffffffffffff5b0);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void search_intra_modes_in_interframe(
    InterModeSearchState *search_state, const AV1_COMP *cpi, MACROBLOCK *x,
    RD_STATS *rd_cost, BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx,
    const InterModeSFArgs *sf_args, unsigned int intra_ref_frame_cost,
    int64_t yrd_threshold) {
  const AV1_COMMON *const cm = &cpi->common;
  const SPEED_FEATURES *const sf = &cpi->sf;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  IntraModeSearchState *intra_search_state = &search_state->intra_search_state;

  int is_best_y_mode_intra = 0;
  RD_STATS best_intra_rd_stats_y;
  int64_t best_rd_y = INT64_MAX;
  int best_mode_cost_y = -1;
  MB_MODE_INFO best_mbmi = *xd->mi[0];
  THR_MODES best_mode_enum = THR_INVALID;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const int num_4x4 = bsize_to_num_blk(bsize);

  // Performs luma search
  int64_t best_model_rd = INT64_MAX;
  int64_t top_intra_model_rd[TOP_INTRA_MODEL_COUNT];
  for (int i = 0; i < TOP_INTRA_MODEL_COUNT; i++) {
    top_intra_model_rd[i] = INT64_MAX;
  }

  if (cpi->oxcf.algo_cfg.sharpness) {
    int bh = mi_size_high[bsize];
    int bw = mi_size_wide[bsize];
    if (bh > 4 || bw > 4) return;
  }

  for (int mode_idx = 0; mode_idx < LUMA_MODE_COUNT; ++mode_idx) {
    if (sf->intra_sf.skip_intra_in_interframe &&
        search_state->intra_search_state.skip_intra_modes)
      break;
    set_y_mode_and_delta_angle(
        mode_idx, mbmi, sf->intra_sf.prune_luma_odd_delta_angles_in_intra);
    assert(mbmi->mode < INTRA_MODE_END);

    // Use intra_y_mode_mask speed feature to skip intra mode evaluation.
    if (sf_args->mode_skip_mask->pred_modes[INTRA_FRAME] & (1 << mbmi->mode))
      continue;

    const THR_MODES mode_enum =
        get_prediction_mode_idx(mbmi->mode, INTRA_FRAME, NONE_FRAME);
    if ((!intra_mode_cfg->enable_smooth_intra ||
         cpi->sf.intra_sf.disable_smooth_intra) &&
        (mbmi->mode == SMOOTH_PRED || mbmi->mode == SMOOTH_H_PRED ||
         mbmi->mode == SMOOTH_V_PRED))
      continue;
    if (!intra_mode_cfg->enable_paeth_intra && mbmi->mode == PAETH_PRED)
      continue;
    if (av1_is_directional_mode(mbmi->mode) &&
        !(av1_use_angle_delta(bsize) && intra_mode_cfg->enable_angle_delta) &&
        mbmi->angle_delta[PLANE_TYPE_Y] != 0)
      continue;
    const PREDICTION_MODE this_mode = mbmi->mode;

    assert(av1_mode_defs[mode_enum].ref_frame[0] == INTRA_FRAME);
    assert(av1_mode_defs[mode_enum].ref_frame[1] == NONE_FRAME);
    init_mbmi(mbmi, this_mode, av1_mode_defs[mode_enum].ref_frame, cm);
    x->txfm_search_info.skip_txfm = 0;

    if (this_mode != DC_PRED) {
      // Only search the oblique modes if the best so far is
      // one of the neighboring directional modes
      if ((sf->rt_sf.mode_search_skip_flags & FLAG_SKIP_INTRA_BESTINTER) &&
          (this_mode >= D45_PRED && this_mode <= PAETH_PRED)) {
        if (search_state->best_mode_index != THR_INVALID &&
            search_state->best_mbmode.ref_frame[0] > INTRA_FRAME)
          continue;
      }
      if (sf->rt_sf.mode_search_skip_flags & FLAG_SKIP_INTRA_DIRMISMATCH) {
        if (conditional_skipintra(
                this_mode, search_state->intra_search_state.best_intra_mode))
          continue;
      }
    }

    RD_STATS intra_rd_stats_y;
    int mode_cost_y;
    int64_t intra_rd_y = INT64_MAX;
    const int is_luma_result_valid = av1_handle_intra_y_mode(
        intra_search_state, cpi, x, bsize, intra_ref_frame_cost, ctx,
        &intra_rd_stats_y, search_state->best_rd, &mode_cost_y, &intra_rd_y,
        &best_model_rd, top_intra_model_rd);

    if (intra_rd_y < INT64_MAX) {
      adjust_cost(cpi, x, &intra_rd_y);
    }

    if (is_luma_result_valid && intra_rd_y < yrd_threshold) {
      is_best_y_mode_intra = 1;
      if (intra_rd_y < best_rd_y) {
        best_intra_rd_stats_y = intra_rd_stats_y;
        best_mode_cost_y = mode_cost_y;
        best_rd_y = intra_rd_y;
        best_mbmi = *mbmi;
        best_mode_enum = mode_enum;
        memcpy(best_blk_skip, x->txfm_search_info.blk_skip,
               sizeof(best_blk_skip[0]) * num_4x4);
        av1_copy_array(best_tx_type_map, xd->tx_type_map, num_4x4);
      }
    }
  }

  if (!is_best_y_mode_intra) {
    return;
  }

  assert(best_rd_y < INT64_MAX);

  // Restores the best luma mode
  *mbmi = best_mbmi;
  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * num_4x4);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, num_4x4);

  // Performs chroma search
  RD_STATS intra_rd_stats, intra_rd_stats_uv;
  av1_init_rd_stats(&intra_rd_stats);
  av1_init_rd_stats(&intra_rd_stats_uv);
  const int num_planes = av1_num_planes(cm);
  if (num_planes > 1) {
    const int intra_uv_mode_valid = av1_search_intra_uv_modes_in_interframe(
        intra_search_state, cpi, x, bsize, &intra_rd_stats,
        &best_intra_rd_stats_y, &intra_rd_stats_uv, search_state->best_rd);

    if (!intra_uv_mode_valid) {
      return;
    }
  }

  // Merge the luma and chroma rd stats
  assert(best_mode_cost_y >= 0);
  intra_rd_stats.rate = best_intra_rd_stats_y.rate + best_mode_cost_y;
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(bsize)) {
    // av1_pick_uniform_tx_size_type_yrd above includes the cost of the tx_size
    // in the tokenonly rate, but for intra blocks, tx_size is always coded
    // (prediction granularity), so we account for it in the full rate,
    // not the tokenonly rate.
    best_intra_rd_stats_y.rate -= tx_size_cost(x, bsize, mbmi->tx_size);
  }

  const ModeCosts *mode_costs = &x->mode_costs;
  const PREDICTION_MODE mode = mbmi->mode;
  if (num_planes > 1 && xd->is_chroma_ref) {
    const int uv_mode_cost =
        mode_costs->intra_uv_mode_cost[is_cfl_allowed(xd)][mode][mbmi->uv_mode];
    intra_rd_stats.rate +=
        intra_rd_stats_uv.rate +
        intra_mode_info_cost_uv(cpi, x, mbmi, bsize, uv_mode_cost);
  }

  // Intra block is always coded as non-skip
  intra_rd_stats.skip_txfm = 0;
  intra_rd_stats.dist = best_intra_rd_stats_y.dist + intra_rd_stats_uv.dist;
  // Add in the cost of the no skip flag.
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  intra_rd_stats.rate += mode_costs->skip_txfm_cost[skip_ctx][0];
  // Calculate the final RD estimate for this mode.
  const int64_t this_rd =
      RDCOST(x->rdmult, intra_rd_stats.rate, intra_rd_stats.dist);
  // Keep record of best intra rd
  if (this_rd < search_state->best_intra_rd) {
    search_state->best_intra_rd = this_rd;
    intra_search_state->best_intra_mode = mode;
  }

  for (int i = 0; i < REFERENCE_MODES; ++i) {
    search_state->best_pred_rd[i] =
        AOMMIN(search_state->best_pred_rd[i], this_rd);
  }

  intra_rd_stats.rdcost = this_rd;

  adjust_rdcost(cpi, x, &intra_rd_stats);

  // Collect mode stats for multiwinner mode processing
  const int txfm_search_done = 1;
  store_winner_mode_stats(
      &cpi->common, x, mbmi, &intra_rd_stats, &best_intra_rd_stats_y,
      &intra_rd_stats_uv, best_mode_enum, NULL, bsize, intra_rd_stats.rdcost,
      cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
  if (intra_rd_stats.rdcost < search_state->best_rd) {
    update_search_state(search_state, rd_cost, ctx, &intra_rd_stats,
                        &best_intra_rd_stats_y, &intra_rd_stats_uv,
                        best_mode_enum, x, txfm_search_done);
  }
}